

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::anon_unknown_27::ParseUSDZHeader
               (uint8_t *addr,size_t length,
               vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               *assets,string *warn,string *err)

{
  ushort uVar1;
  char *pcVar2;
  reference pvVar3;
  ushort *puVar4;
  void *__dest;
  uint *puVar5;
  undefined1 local_128 [8];
  USDZAssetInfo info;
  uint32_t uncompr_bytes;
  uint16_t compr_method;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ushort local_8c;
  allocator local_89;
  string local_88 [4];
  uint16_t extra_field_len;
  string varname;
  int local_60;
  uint16_t name_len;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> local_header;
  size_t offset;
  string *err_local;
  string *warn_local;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  *assets_local;
  size_t length_local;
  uint8_t *addr_local;
  
  if (addr == (uint8_t *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"null for `addr` argument.\n");
    }
    addr_local._7_1_ = 0;
  }
  else if (length < 0x76) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=
                ((string *)err,"File size too short. Looks like this file is not a USDZ\n");
    }
    addr_local._7_1_ = 0;
  }
  else {
    local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
    do {
      if (length <= local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                    0x1e) goto LAB_0012edb6;
      ::std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_58,0x1e,
                 (allocator_type *)((long)&name_len + 1));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&name_len + 1));
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_58);
      *(undefined8 *)pcVar2 =
           *(undefined8 *)
            (addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      *(undefined8 *)(pcVar2 + 8) =
           *(undefined8 *)
            (addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 8)
      ;
      *(undefined8 *)(pcVar2 + 0x10) =
           *(undefined8 *)
            (addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                    0x10);
      *(undefined4 *)(pcVar2 + 0x18) =
           *(undefined4 *)
            (addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                    0x18);
      *(undefined2 *)(pcVar2 + 0x1c) =
           *(undefined2 *)
            (addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                    0x1c);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_58,0);
      if ((((*pvVar3 == 'P') &&
           (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_58,1), *pvVar3 == 'K'))
          && (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)local_58,2),
             *pvVar3 == '\x03')) &&
         (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_58,3), *pvVar3 == '\x04')
         ) {
        local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x1e;
        puVar4 = (ushort *)
                 std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_58,0x1a);
        uVar1 = *puVar4;
        if (length < local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                     (ulong)uVar1) {
          if (err != (string *)0x0) {
            ::std::__cxx11::string::operator+=((string *)err,"Invalid ZIP data\n");
          }
          addr_local._7_1_ = 0;
          local_60 = 1;
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_88,(ulong)uVar1,' ',&local_89);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
          __dest = (void *)::std::__cxx11::string::operator[]((ulong)local_88);
          memcpy(__dest,addr + local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               _16_8_,(ulong)uVar1);
          local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
               (ulong)uVar1 +
               local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
          puVar4 = (ushort *)
                   std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)local_58,0x1c);
          local_8c = *puVar4;
          if ((local_8c == 0) ||
             (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
              (ulong)local_8c <= length)) {
            local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
                 (ulong)local_8c +
                 local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
            if ((local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ & 0x3f)
                == 0) {
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)local_58,0);
              info.byte_end._6_2_ = *(short *)(pvVar3 + 8);
              puVar5 = (uint *)std::vector<char,_std::allocator<char>_>::operator[]
                                         ((vector<char,_std::allocator<char>_> *)local_58,0x16);
              info.byte_end._0_4_ = *puVar5;
              if (info.byte_end._6_2_ == 0) {
                if (assets != (vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)0x0) {
                  USDZAssetInfo::USDZAssetInfo((USDZAssetInfo *)local_128);
                  ::std::__cxx11::string::operator=((string *)local_128,local_88);
                  info._24_8_ = local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                ._16_8_;
                  info.byte_begin =
                       local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ +
                       (ulong)(uint)info.byte_end;
                  std::
                  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                  ::push_back(assets,(value_type *)local_128);
                  USDZAssetInfo::~USDZAssetInfo((USDZAssetInfo *)local_128);
                }
                local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
                     (ulong)(uint)info.byte_end +
                     local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
                local_60 = 0;
              }
              else {
                if (err != (string *)0x0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)err,"Compressed ZIP is not supported for USDZ\n");
                }
                addr_local._7_1_ = 0;
                local_60 = 1;
              }
            }
            else {
              if (err != (string *)0x0) {
                std::__cxx11::to_string
                          ((__cxx11 *)&uncompr_bytes,
                           local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           _16_8_);
                ::std::operator+((char *)&local_d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Data offset must be mulitple of 64bytes for USDZ, but got ");
                ::std::operator+(&local_b0,&local_d0,".\n");
                ::std::__cxx11::string::operator+=((string *)err,(string *)&local_b0);
                ::std::__cxx11::string::~string((string *)&local_b0);
                ::std::__cxx11::string::~string((string *)&local_d0);
                ::std::__cxx11::string::~string((string *)&uncompr_bytes);
              }
              addr_local._7_1_ = 0;
              local_60 = 1;
            }
          }
          else {
            if (err != (string *)0x0) {
              ::std::__cxx11::string::operator+=
                        ((string *)err,"Invalid extra field length in ZIP data\n");
            }
            addr_local._7_1_ = 0;
            local_60 = 1;
          }
          ::std::__cxx11::string::~string(local_88);
        }
      }
      else if (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ == 0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::operator+=((string *)err,"PKZIP header not found.\n");
        }
        addr_local._7_1_ = 0;
        local_60 = 1;
      }
      else {
        local_60 = 3;
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_58);
    } while (local_60 == 0);
    if (local_60 != 1) {
LAB_0012edb6:
      addr_local._7_1_ = 1;
    }
  }
  return (bool)(addr_local._7_1_ & 1);
}

Assistant:

bool ParseUSDZHeader(const uint8_t *addr, const size_t length,
                     std::vector<USDZAssetInfo> *assets, std::string *warn,
                     std::string *err) {
  (void)warn;

  if (!addr) {
    if (err) {
      (*err) += "null for `addr` argument.\n";
    }
    return false;
  }

  if (length < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
    // ???
    if (err) {
      (*err) += "File size too short. Looks like this file is not a USDZ\n";
    }
    return false;
  }

  size_t offset = 0;
  while ((offset + 30) < length) {
    //
    // PK zip format:
    // https://users.cs.jmu.edu/buchhofp/forensics/formats/pkzip.html
    //
    std::vector<char> local_header(30);
    memcpy(local_header.data(), addr + offset, 30);

    // Check signagure(first 4 bytes)
    // Must be \x50\x4b\x03\x04
    if ((local_header[0] == 0x50) && (local_header[1] == 0x4b) &&
        (local_header[2] == 0x03) && (local_header[3] == 0x04)) {
      // ok

      // TODO: Check other header info(version, flags, crc32)
    } else {
      if (offset == 0) {
        // Invalid header found.
        if (err) {
          (*err) += "PKZIP header not found.\n";
        }
        return false;
      } else {
        // not a local(global?) header
        // Maybe near to the end of file.
        break;
      }
    }

    offset += 30;

    // read in the variable name
    uint16_t name_len;
    memcpy(&name_len, &local_header[26], sizeof(uint16_t));
    if ((offset + name_len) > length) {
      if (err) {
        (*err) += "Invalid ZIP data\n";
      }
      return false;
    }

    std::string varname(name_len, ' ');
    memcpy(&varname[0], addr + offset, name_len);

    offset += name_len;

    // read in the extra field
    uint16_t extra_field_len;
    memcpy(&extra_field_len, &local_header[28], sizeof(uint16_t));
    if (extra_field_len > 0) {
      if (offset + extra_field_len > length) {
        if (err) {
          (*err) += "Invalid extra field length in ZIP data\n";
        }
        return false;
      }
    }

    offset += extra_field_len;

    // In usdz, data must be aligned at 64bytes boundary.
    if ((offset % 64) != 0) {
      if (err) {
        (*err) += "Data offset must be mulitple of 64bytes for USDZ, but got " +
                  std::to_string(offset) + ".\n";
      }
      return false;
    }

    uint16_t compr_method = *reinterpret_cast<uint16_t *>(&local_header[0] + 8);
    // uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
    uint32_t uncompr_bytes;
    memcpy(&uncompr_bytes, &local_header[22], sizeof(uncompr_bytes));

    // USDZ only supports uncompressed ZIP
    if (compr_method != 0) {
      if (err) {
        (*err) += "Compressed ZIP is not supported for USDZ\n";
      }
      return false;
    }

    if (assets) {
      USDZAssetInfo info;
      DCOUT("USDZasset[" << assets->size() << "] " << varname << ", byte_begin " << offset << ", length " << uncompr_bytes << "\n");
      info.filename = varname;
      info.byte_begin = offset;
      info.byte_end = offset + uncompr_bytes;

      assets->push_back(info);
    }

    offset += uncompr_bytes;
  }

  return true;
}